

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

CharClassBuilder * __thiscall re2::CharClassBuilder::Copy(CharClassBuilder *this)

{
  uint32 uVar1;
  CharClassBuilder *this_00;
  _Base_ptr p_Var2;
  RuneRange local_38;
  
  this_00 = (CharClassBuilder *)operator_new(0x40);
  CharClassBuilder(this_00);
  for (p_Var2 = (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->ranges_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    local_38.lo = p_Var2[1]._M_color;
    local_38.hi = *(Rune *)&p_Var2[1].field_0x4;
    std::
    _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
    ::_M_insert_unique<re2::RuneRange>(&(this_00->ranges_)._M_t,&local_38);
  }
  uVar1 = this->lower_;
  this_00->upper_ = this->upper_;
  this_00->lower_ = uVar1;
  this_00->nrunes_ = this->nrunes_;
  return this_00;
}

Assistant:

CharClassBuilder* CharClassBuilder::Copy() {
  CharClassBuilder* cc = new CharClassBuilder;
  for (iterator it = begin(); it != end(); ++it)
    cc->ranges_.insert(RuneRange(it->lo, it->hi));
  cc->upper_ = upper_;
  cc->lower_ = lower_;
  cc->nrunes_ = nrunes_;
  return cc;
}